

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamlGenerator.cpp
# Opt level: O0

void print(ostream *output,ScHistoryState *historyState)

{
  ostream *poVar1;
  char *pcVar2;
  ScHistoryState *historyState_local;
  ostream *output_local;
  
  if (historyState->mode != None) {
    std::operator<<(output,"  history:\n");
    poVar1 = std::operator<<(output,"    mode: ");
    pcVar2 = toString(historyState->mode);
    poVar1 = std::operator<<(poVar1,pcVar2);
    std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(output,"    initial: ");
    poVar1 = std::operator<<(poVar1,(string *)&historyState->initial);
    std::operator<<(poVar1,"\n");
  }
  return;
}

Assistant:

static void print(std::ostream &output, const ScHistoryState &historyState) noexcept
{
    if (historyState.mode != ScHistoryMode::None) {
        output << "  history:\n";
        output << "    mode: " << toString(historyState.mode) << "\n";
        output << "    initial: " << historyState.initial << "\n";
    }
}